

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFFileSpecObjectHelper *
QPDFFileSpecObjectHelper::createFileSpec
          (QPDFFileSpecObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *filename,
          QPDFEFStreamObjectHelper *efsoh)

{
  BaseHandle *pBVar1;
  QPDFObjectHandle oh;
  QPDFObjectHandle ef;
  allocator<char> local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [16];
  string local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFObjectHandle local_68 [2];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  QPDFObjectHandle::newDictionary();
  QPDF::makeIndirectObject((QPDF *)&local_78,(QPDFObjectHandle *)qpdf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 0x10),"/Type",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"/Filespec",&local_a9);
  QPDFObjectHandle::newName((string *)local_a8);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)&local_78,(string *)(local_a8 + 0x10),(QPDFObjectHandle *)local_a8)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,&local_78);
  QPDFFileSpecObjectHelper(__return_storage_ptr__,(QPDFObjectHandle *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 0x10),"",(allocator<char> *)local_68);
  setFilename(__return_storage_ptr__,filename,(string *)(local_a8 + 0x10));
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  QPDFObjectHandle::newDictionary();
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 0x10),"/F",&local_aa);
  pBVar1 = &(efsoh->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  QPDFObjectHandle::replaceKey(local_68,(string *)(local_a8 + 0x10),(QPDFObjectHandle *)local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_a8 + 0x10),"/UF",&local_aa);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  QPDFObjectHandle::replaceKey(local_68,(string *)(local_a8 + 0x10),(QPDFObjectHandle *)local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 0x10),"/EF",(allocator<char> *)local_a8);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_78,(string *)(local_a8 + 0x10),local_68);
  std::__cxx11::string::~string((string *)(local_a8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

QPDFFileSpecObjectHelper
QPDFFileSpecObjectHelper::createFileSpec(
    QPDF& qpdf, std::string const& filename, QPDFEFStreamObjectHelper efsoh)
{
    auto oh = qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
    oh.replaceKey("/Type", QPDFObjectHandle::newName("/Filespec"));
    QPDFFileSpecObjectHelper result(oh);
    result.setFilename(filename);
    auto ef = QPDFObjectHandle::newDictionary();
    ef.replaceKey("/F", efsoh.getObjectHandle());
    ef.replaceKey("/UF", efsoh.getObjectHandle());
    oh.replaceKey("/EF", ef);
    return result;
}